

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<int,_std::allocator<int>_> *variable,string *value)

{
  char *__nptr;
  vector<int,_std::allocator<int>_> *in_RSI;
  char *res;
  value_type_conflict6 *in_stack_ffffffffffffffc8;
  char *local_20 [4];
  
  local_20[0] = (char *)0x0;
  __nptr = (char *)std::__cxx11::string::c_str();
  strtol(__nptr,local_20,10);
  std::vector<int,_std::allocator<int>_>::push_back(in_RSI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<int>* variable,
                                            const std::string& value)
{
  char* res = nullptr;
  variable->push_back(static_cast<int>(strtol(value.c_str(), &res, 10)));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}